

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

void test_ffx(void)

{
  st_ptls_cipher_context_t *psVar1;
  int iVar2;
  ptls_cipher_context_t *ppVar3;
  ptls_cipher_context_t *ppVar4;
  ptls_cipher_context_t *ctx;
  st_ptls_ffx_test_variants_t *psVar5;
  size_t __n;
  undefined8 local_80;
  uint8_t encrypted [32];
  uint8_t result [32];
  
  for (psVar5 = ffx_variants; psVar5->algo != (ptls_cipher_algorithm_t *)0x0; psVar5 = psVar5 + 1) {
    ppVar3 = ptls_cipher_new(psVar5->algo,1,test_ffx::ffx_test_key);
    ppVar4 = ptls_cipher_new(psVar5->algo,0,test_ffx::ffx_test_key);
    ctx = ptls_cipher_new(psVar5->algo,0,test_ffx::ffx_test_bad_key);
    local_80 = ppVar3;
    _ok((uint)(ctx != (ptls_cipher_context_t *)0x0 &&
              (ppVar4 != (ptls_cipher_context_t *)0x0 && ppVar3 != (ptls_cipher_context_t *)0x0)),
        "%s %d","/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",
        0x154);
    psVar1 = local_80;
    if (ctx != (ptls_cipher_context_t *)0x0 &&
        (ppVar4 != (ptls_cipher_context_t *)0x0 && ppVar3 != (ptls_cipher_context_t *)0x0)) {
      iVar2 = psVar5->bit_length;
      (*local_80->do_init)(local_80,test_ffx::ffx_test_iv);
      __n = (size_t)((iVar2 + 7) / 8);
      (*psVar1->do_transform)(psVar1,encrypted,test_ffx::ffx_test_source,__n);
      _ok((uint)((""[iVar2 % 8] &
                 (*(byte *)((long)&test_handshake::cb_1.cb + __n + 7) ^ encrypted[__n - 1])) == 0),
          "%s %d","/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",
          0x15b);
      (*ppVar4->do_init)(ppVar4,test_ffx::ffx_test_iv);
      (*ppVar4->do_transform)(ppVar4,result,encrypted,__n);
      iVar2 = bcmp(test_ffx::ffx_test_source,result,__n);
      _ok((uint)(iVar2 == 0),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x15f);
      (*ppVar4->do_init)(ppVar4,test_ffx::ffx_test_bad_iv);
      (*ppVar4->do_transform)(ppVar4,result,encrypted,__n);
      iVar2 = bcmp(test_ffx::ffx_test_source,result,__n);
      _ok((uint)(iVar2 != 0),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x163);
      (*ctx->do_init)(ctx,test_ffx::ffx_test_iv);
      (*ctx->do_transform)(ctx,result,encrypted,__n);
      iVar2 = bcmp(test_ffx::ffx_test_source,result,__n);
      _ok((uint)(iVar2 != 0),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x167);
LAB_00116ba6:
      ptls_cipher_free(local_80);
    }
    else if (local_80 != (st_ptls_cipher_context_t *)0x0) goto LAB_00116ba6;
    if (ppVar4 != (ptls_cipher_context_t *)0x0) {
      ptls_cipher_free(ppVar4);
    }
    if (ctx != (ptls_cipher_context_t *)0x0) {
      ptls_cipher_free(ctx);
    }
  }
  if (ffx_variants[2].bit_length != 0x35) {
    __assert_fail("ffx_variants[2].bit_length == 53",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",
                  0x178,"void test_ffx(void)");
  }
  ppVar3 = ptls_ffx_new(&ptls_minicrypto_aes128ctr,1,4,0x35,test_ffx::ffx_test_key);
  ppVar4 = ptls_cipher_new(ffx_variants[2].algo,0,test_ffx::ffx_test_key);
  _ok((uint)(ppVar4 != (ptls_cipher_context_t *)0x0 && ppVar3 != (ptls_cipher_context_t *)0x0),
      "%s %d","/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",
      0x17b);
  if (ppVar4 != (ptls_cipher_context_t *)0x0 && ppVar3 != (ptls_cipher_context_t *)0x0) {
    (*ppVar3->do_init)(ppVar3,test_ffx::ffx_test_iv);
    (*ppVar3->do_transform)(ppVar3,encrypted,test_ffx::ffx_test_source,7);
    (*ppVar4->do_init)(ppVar4,test_ffx::ffx_test_iv);
    (*ppVar4->do_transform)(ppVar4,result,encrypted,7);
    iVar2 = bcmp(test_ffx::ffx_test_source,result,7);
    _ok((uint)(iVar2 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x181);
  }
  else if (ppVar3 == (ptls_cipher_context_t *)0x0) goto LAB_00116cd5;
  ptls_cipher_free(ppVar3);
LAB_00116cd5:
  if (ppVar4 != (ptls_cipher_context_t *)0x0) {
    ptls_cipher_free(ppVar4);
  }
  return;
}

Assistant:

static void test_ffx(void)
{
    static uint8_t ffx_test_source[32] = {'0', '1', '2', '3', '4', '5', '6', '7', '8', '9', 'a', 'b', 'c', 'd', 'e', 'f',
                                          'g', 'h', 'i', 'j', 'k', 'l', 'm', 'n', 'o', 'p', 'q', 'r', 's', 't', 'u', 'v'};

    static uint8_t ffx_test_key[32] = {1,  2,  3,  4,  5,  6,  7,  8,  9,  10, 11, 12, 13, 14, 15, 16,
                                       17, 18, 19, 20, 21, 22, 23, 24, 25, 27, 28, 29, 30, 31, 32};
    static uint8_t ffx_test_bad_key[32] = {0,  1,  2,  3,  4,  5,  6,  7,  8,  9,  10, 11, 12, 13, 14, 15,
                                           16, 17, 18, 19, 20, 21, 22, 23, 24, 25, 27, 28, 29, 30, 31};

    static uint8_t ffx_test_iv[16] = {10, 11, 12, 13, 14, 15, 16, 17, 18, 19, 20, 21, 22, 23, 24, 25};
    static uint8_t ffx_test_bad_iv[16] = {11, 12, 13, 14, 15, 16, 17, 18, 19, 20, 21, 22, 23, 24, 25, 26};

    static uint8_t ffx_test_mask[8] = {0x00, 0x01, 0x03, 0x07, 0x0F, 0x1F, 0x3F, 0x7F};
    ptls_cipher_context_t *ffx_enc = NULL;
    ptls_cipher_context_t *ffx_dec = NULL;
    ptls_cipher_context_t *ffx_dec_bad = NULL;
    uint8_t encrypted[32];
    uint8_t result[32];

    for (int i = 0; ffx_variants[i].algo != NULL; i++) {
        ffx_enc = ptls_cipher_new(ffx_variants[i].algo, 1, ffx_test_key);
        ffx_dec = ptls_cipher_new(ffx_variants[i].algo, 0, ffx_test_key);
        ffx_dec_bad = ptls_cipher_new(ffx_variants[i].algo, 0, ffx_test_bad_key);
        ok(ffx_enc != NULL && ffx_dec != NULL && ffx_dec_bad != NULL);
        if (ffx_enc != NULL && ffx_dec != NULL && ffx_dec_bad != NULL) {
            int bit_length = ffx_variants[i].bit_length;
            int len = (bit_length + 7) / 8;
            /* test that encoding works and last byte is correct */
            ptls_cipher_init(ffx_enc, ffx_test_iv);
            ptls_cipher_encrypt(ffx_enc, encrypted, ffx_test_source, len);
            ok((encrypted[len - 1] & ffx_test_mask[bit_length % 8]) == (ffx_test_source[len - 1] & ffx_test_mask[bit_length % 8]));
            /* Test that decoding with good key and IV works*/
            ptls_cipher_init(ffx_dec, ffx_test_iv);
            ptls_cipher_encrypt(ffx_dec, result, encrypted, len);
            ok(memcmp(ffx_test_source, result, len) == 0);
            /* Test that decoding with bad IV fails */
            ptls_cipher_init(ffx_dec, ffx_test_bad_iv);
            ptls_cipher_encrypt(ffx_dec, result, encrypted, len);
            ok(memcmp(ffx_test_source, result, len) != 0);
            /* Test that decoding with bad key fails */
            ptls_cipher_init(ffx_dec_bad, ffx_test_iv);
            ptls_cipher_encrypt(ffx_dec_bad, result, encrypted, len);
            ok(memcmp(ffx_test_source, result, len) != 0);
        }
        if (ffx_enc != NULL) {
            ptls_cipher_free(ffx_enc);
        }
        if (ffx_dec != NULL) {
            ptls_cipher_free(ffx_dec);
        }
        if (ffx_dec_bad != NULL) {
            ptls_cipher_free(ffx_dec_bad);
        }
    }

    /* Test the direct usage of the API with the "ptls_ffx_new" function.
     * The test verifies that ptls_ffx_new is compatible with
     * creating an ffx variant with the macro, then creating the cipher.
     */
    assert(ffx_variants[2].bit_length == 53); /* assumes that ffx_variants[0] is ffx_aes128ctr_b53_r4 */
    ffx_enc = ptls_ffx_new(&ptls_minicrypto_aes128ctr, 1, 4, 53, ffx_test_key);
    ffx_dec = ptls_cipher_new(ffx_variants[2].algo, 0, ffx_test_key);
    ok(ffx_enc != NULL && ffx_dec != NULL);
    if (ffx_enc != NULL && ffx_dec != NULL) {
        ptls_cipher_init(ffx_enc, ffx_test_iv);
        ptls_cipher_encrypt(ffx_enc, encrypted, ffx_test_source, 7);
        ptls_cipher_init(ffx_dec, ffx_test_iv);
        ptls_cipher_encrypt(ffx_dec, result, encrypted, 7);
        ok(memcmp(ffx_test_source, result, 7) == 0);
    }
    if (ffx_enc != NULL) {
        ptls_cipher_free(ffx_enc);
    }
    if (ffx_dec != NULL) {
        ptls_cipher_free(ffx_dec);
    }
}